

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo_CH_linalg.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  ostream *poVar4;
  Scalar *pSVar5;
  Scalar *pSVar6;
  void *pvVar7;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar8;
  CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *pCVar9;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_> *pCVar10;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *pCVar11;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  Scalar SVar12;
  Scalar SVar13;
  Vector3d x;
  Vector3d b;
  ChMatrixNM<double,_3,_3> A_5;
  ChVector<double> vl4;
  ChVector<double> vl3;
  ChVector<double> vl2;
  ChVector<double> vl1;
  ChVector<double> va4;
  ChVector<double> va3;
  ChVector<double> va2;
  ChVector<double> va1;
  Coordsys csys;
  ChMatrix33<double> R_1;
  ChQuaternion<double> q_1;
  ChVector<double> t;
  ChVector<double> vl;
  ChStarMatrix44<double> X_1;
  ChQuaternion<double> q2;
  ChMatrix44<> A44;
  ChMatrix43<> res4;
  ChMatrix43<> res3;
  ChMatrix34<> res2_1;
  ChMatrix34<> res1_1;
  ChMatrix33<double> rot;
  ChMatrix43<> Gt;
  ChVector<double> v_2;
  ChQuaternion<double> q;
  ChMatrix34<> G;
  ChVector<double> res2;
  ChVector<double> res1;
  ChMatrix33<double> B_4;
  ChMatrix33<double> A_4;
  ChVector<double> v_1;
  ChMatrixDynamic<> X;
  ChMatrixNM<double,_5,_7> C_1;
  ChMatrixNM<double,_2,_3> B_3;
  ChMatrixDynamic<> A_3;
  ChMatrixDynamic<> B_2;
  ChMatrixNM<double,_2,_3> A_2;
  ChVectorDynamic<> w;
  ChVectorDynamic<> v;
  ChMatrixNM<double,_2,_3> B_1;
  ChMatrixNM<double,_2,_3> A_1;
  ChMatrix33<double> R;
  ChMatrixDynamic<double> CD_t;
  ChMatrixDynamic<double> CD;
  ChMatrixDynamic<> D;
  ChMatrixDynamic<> C;
  ChMatrixDynamic<> result;
  ChMatrixDynamic<double> B;
  ChMatrixNM<double,_2,_3> A;
  ChMatrixDynamic<> M3;
  ChMatrixDynamic<> M2;
  ChMatrixDynamic<> M1;
  ChMatrix33<double> ma;
  ChMatrixNM<double,_4,_4> Ms;
  ChMatrixDynamic<> Md2;
  ChMatrixDynamic<> Md1;
  Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_13b8;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_13a8;
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_1388;
  Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_1290;
  Matrix<double,3,1,0,3,1> local_1280 [24];
  Scalar local_1268;
  Scalar local_1260;
  Scalar local_1258;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_1250;
  Scalar local_1230;
  Scalar local_1228;
  Scalar local_1220;
  Scalar local_1218;
  Scalar local_1210;
  Scalar local_1208;
  Scalar local_1200;
  Scalar local_11f8;
  Scalar local_11f0;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_11e8;
  Matrix<double,_3,_1,_0,_3,_1> local_11c8;
  DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_11b0 [72];
  ChVector<double> local_1168;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_1150;
  ChVector<double> local_1148;
  ChVector<double> local_1130;
  ChVector<double> local_1118;
  ChVector<double> local_1100;
  ChVector<double> local_10e8;
  ChVector<double> local_10d0;
  ChVector<double> local_10b8;
  ChVector<double> local_10a0;
  ChVector<double> local_1088;
  ChCoordsys<double> local_1070;
  DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_1038 [72];
  ChQuaternion<double> local_ff0;
  ChVector<double> local_fd0;
  ChVector<double> local_fb8;
  ChQuaternion<double> local_fa0;
  DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> local_f80 [160];
  ChQuaternion<double> local_ee0;
  DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> local_ec0 [136];
  non_const_type local_e38;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
  local_e30;
  Matrix<double,4,3,0,4,3> local_e20 [112];
  Product<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0> local_db0;
  Matrix<double,4,3,0,4,3> local_da0 [104];
  non_const_type local_d38;
  Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_4,_3,_0,_4,_3>_>,_0>
  local_d30;
  Matrix<double,3,4,1,3,4> local_d20 [112];
  Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_4,_1,_3,_4>,_0> local_cb0;
  Matrix<double,3,4,1,3,4> local_ca0 [112];
  non_const_type local_c30;
  ChQuaternion<double> local_c28;
  DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_c08 [72];
  Transpose<Eigen::Matrix<double,_3,_4,_1,_3,_4>_> local_bc0;
  ChQuaternion<double> local_bb8;
  ChQuaternion<double> local_b98;
  non_const_type local_b78;
  int local_b6c;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_3,_0,_4,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>_>
  local_b68;
  Matrix<double,4,3,0,4,3> local_b40 [120];
  ChVector<double> local_ac8;
  ChQuaternion<double> local_ab0;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_4,_0,_3,_4>_>_>
  local_a90 [16];
  Matrix<double,3,4,1,3,4> local_a80 [112];
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_a10;
  ChVector<double> local_a08;
  ChVector<double> local_9f0;
  DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_9d8 [72];
  DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_990 [72];
  ChVector<double> local_948;
  Type local_930;
  Type local_900;
  Type local_8d0;
  Matrix<double,__1,__1,_1,__1,__1> local_8a0;
  Scalar local_888;
  Scalar local_880;
  Scalar local_878;
  Scalar local_870;
  Scalar local_868;
  Scalar local_860;
  Type local_858;
  CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_> local_828;
  Matrix<double,_5,_7,_1,_5,_7> local_808;
  Scalar local_6f0;
  Scalar local_6e8;
  Scalar local_6e0;
  Scalar local_6d8;
  Scalar local_6d0;
  Scalar local_6c8;
  CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> local_6c0;
  Matrix<double,_2,_3,_1,_2,_3> local_6a0;
  int local_668 [2];
  Matrix<double,__1,__1,_1,__1,__1> local_660;
  Matrix<double,__1,__1,_1,__1,__1> local_648;
  DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> local_630 [48];
  Scalar local_600;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_5f8;
  Scalar local_5c8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_5c0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  local_5a8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_568;
  Scalar local_550;
  Scalar local_548;
  Scalar local_540;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_538;
  int local_514;
  Matrix<double,__1,_1,_0,__1,_1> local_510;
  Scalar local_500;
  Scalar local_4f8;
  Scalar local_4f0;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_4e8;
  int local_4c4;
  Matrix<double,__1,_1,_0,__1,_1> local_4c0;
  DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_1> local_4b0 [56];
  Scalar local_478;
  DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> local_470 [56];
  Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
  local_438;
  Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_428;
  ChQuaternion<double> local_418;
  ChMatrix33<double> local_3f8;
  non_const_type local_3b0;
  non_const_type local_3a8;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_0>
  local_3a0;
  Matrix<double,__1,__1,_1,__1,__1> local_390;
  Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_378;
  Matrix<double,__1,__1,_1,__1,__1> local_368;
  int local_350 [2];
  Matrix<double,__1,__1,_1,__1,__1> local_348;
  int local_330 [2];
  Matrix<double,__1,__1,_1,__1,__1> local_328;
  Scalar local_310;
  int local_304;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>_>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>_>
  local_300;
  int local_2d4;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>_>_>
  local_2d0;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_2b0;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_298;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
  local_280;
  Matrix<double,__1,__1,_1,__1,__1> local_268;
  int local_250 [2];
  Matrix<double,__1,__1,_1,__1,__1> local_248;
  DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> local_230 [48];
  non_const_type local_200;
  int local_1f8 [2];
  Matrix<double,__1,__1,_1,__1,__1> local_1f0;
  NegativeReturnType local_1d8;
  Matrix<double,__1,__1,_1,__1,__1> local_1c8;
  Matrix<double,__1,__1,_1,__1,__1> local_1b0;
  Scalar local_198;
  Scalar local_190;
  ChMatrix33<double> local_188;
  Matrix<double,_4,_4,_1,_4,_4> local_140;
  int local_a0 [2];
  Matrix<double,__1,__1,_1,__1,__1> local_98;
  int local_80 [2];
  PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> local_78;
  undefined4 local_54;
  
  local_54 = 0;
  poVar4 = std::operator<<((ostream *)&std::cout,"\n=== Creation and assignment ===\n");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_80[1] = 5;
  local_80[0] = 7;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_78,local_80 + 1,local_80);
  local_a0[1] = 4;
  local_a0[0] = 4;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_98,local_a0 + 1,local_a0);
  Eigen::Matrix<double,_4,_4,_1,_4,_4>::Matrix(&local_140);
  chrono::ChMatrix33<double>::ChMatrix33(&local_188);
  local_190 = 0.1;
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>::setConstant
            ((DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)&local_140,&local_190);
  poVar4 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)&local_140);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setRandom
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_78);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::transposeInPlace
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_78);
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::resize(&local_78,2,2);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_78);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_98);
  local_198 = 3.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_98,&local_198);
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&local_98,0,0)
  ;
  *pSVar5 = 10.0;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&local_98,0,0)
  ;
  dVar1 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&local_98,1,1)
  ;
  dVar2 = *pSVar5;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&local_98,1,2)
  ;
  *pSVar5 = dVar1 + dVar2;
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&local_98,2,2)
  ;
  *pSVar5 = 4.0;
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::Matrix(&local_1b0,&local_98);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>::operator-
            (&local_1d8,(DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_> *)&local_140);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::
  Matrix<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,4,4,1,4,4>const>>
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_1c8,&local_1d8);
  local_1f8[1] = 8;
  local_1f8[0] = 4;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_1f0,local_1f8 + 1,local_1f8);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::operator=(&local_1f0,&local_1b0);
  local_200 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_1b0);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::operator=
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_1f0,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_> *)&local_200);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix(&local_1f0);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix(&local_1c8);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix(&local_1b0);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix(&local_98);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix((Matrix<double,__1,__1,_1,__1,__1> *)&local_78);
  poVar4 = std::operator<<((ostream *)&std::cout,"\n=== Matrix operations ===\n");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_2,_3,_1,_2,_3>::Matrix((Matrix<double,_2,_3,_1,_2,_3> *)local_230);
  local_250[1] = 2;
  local_250[0] = 3;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_248,local_250 + 1,local_250);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::setRandom(local_230);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setRandom
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_248);
  Eigen::MatrixBase<Eigen::Matrix<double,2,3,1,2,3>>::operator+
            (&local_280,(MatrixBase<Eigen::Matrix<double,2,3,1,2,3>> *)local_230,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_248);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,2,3,1,2,3>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>>
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_268,&local_280);
  Eigen::MatrixBase<Eigen::Matrix<double,2,3,1,2,3>>::operator+
            (&local_298,(MatrixBase<Eigen::Matrix<double,2,3,1,2,3>> *)local_230,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_248);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::operator=
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_268,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
              *)&local_298);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::operator=
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_268,local_230);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_268,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_248);
  Eigen::MatrixBase<Eigen::Matrix<double,2,3,1,2,3>>::operator-
            (&local_2b0,(MatrixBase<Eigen::Matrix<double,2,3,1,2,3>> *)local_230,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_248);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::operator=
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_268,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_>
              *)&local_2b0);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::operator=
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_268,local_230);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator-=
            ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_268,
             (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_248);
  local_2d4 = 10;
  Eigen::MatrixBase<Eigen::Matrix<double,2,3,1,2,3>>::operator*
            (&local_2d0,(MatrixBase<Eigen::Matrix<double,2,3,1,2,3>> *)local_230,&local_2d4);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::operator=
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_268,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>_>_>_>
              *)&local_2d0);
  local_304 = 10;
  Eigen::operator*(&local_300,&local_304,(StorageBaseType *)local_230);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::operator=
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_268,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>_>,_const_Eigen::Matrix<double,_2,_3,_1,_2,_3>_>_>
              *)&local_300);
  poVar4 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_268);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::operator=
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_268,local_230);
  local_310 = 10.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_268,&local_310);
  poVar4 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_268);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_330[1] = 3;
  local_330[0] = 2;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_328,local_330 + 1,local_330);
  local_350[1] = 2;
  local_350[0] = 3;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_348,local_350 + 1,local_350);
  local_378 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_328,
                         (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_348);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::
  Matrix<Eigen::Product<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_368,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>_>
              *)&local_378);
  local_3a8 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_348);
  local_3b0 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_328);
  local_3a0 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>> *)
                         &local_3a8,
                         (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>_> *
                         )&local_3b0);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::
  Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,0>>
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_390,
             (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_0>_>
              *)&local_3a0);
  chrono::Q_from_AngX(1.0471975511965976);
  chrono::ChMatrix33<double>::ChMatrix33(&local_3f8,&local_418);
  poVar4 = std::operator<<((ostream *)&std::cout,"rot * matrix\n");
  local_428 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)&local_3f8,
                         (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_328);
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>_>
                                     *)&local_428);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"matrix * rot\n");
  local_438 = Eigen::MatrixBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_348,
                         (MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&local_3f8);
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Product<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
                                     *)&local_438);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix(&local_390);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix(&local_368);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix(&local_348);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix(&local_328);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix(&local_268);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix(&local_248);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "\n=== Chrono extensions to Eigen::MatrixBase ===\n");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_2,_3,_1,_2,_3>::Matrix((Matrix<double,_2,_3,_1,_2,_3> *)local_470);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::setRandom(local_470);
  poVar4 = std::operator<<((ostream *)&std::cout,"random 2x3 matrix A:\n");
  poVar4 = Eigen::operator<<(poVar4,local_470);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Eigen::MatrixBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::fillDiagonal
            ((MatrixBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)local_470,10.1);
  poVar4 = std::operator<<((ostream *)&std::cout,"fill diagonal with 10.1:\n");
  poVar4 = Eigen::operator<<(poVar4,local_470);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_478 = 2.1;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::fill(local_470,&local_478);
  poVar4 = std::operator<<((ostream *)&std::cout,"fill entire matrix with 2.1:\n");
  poVar4 = Eigen::operator<<(poVar4,local_470);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_2,_3,_1,_2,_3>::Matrix
            ((Matrix<double,_2,_3,_1,_2,_3> *)local_4b0,(Matrix<double,_2,_3,_1,_2,_3> *)local_470);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>,_1>::operator()
                     (local_4b0,1,2);
  *pSVar6 = *pSVar6 + 0.01;
  poVar4 = std::operator<<((ostream *)&std::cout,"matrix B = A with B(1,2) incremented by 0.01\n");
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)local_4b0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"|A-B| < 0.1?   ");
  bVar3 = Eigen::MatrixBase<Eigen::Matrix<double,2,3,1,2,3>>::
          equals<Eigen::Matrix<double,2,3,1,2,3>>
                    ((MatrixBase<Eigen::Matrix<double,2,3,1,2,3>> *)local_470,
                     (MatrixBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)local_4b0,0.1);
  pvVar7 = (void *)std::ostream::operator<<(poVar4,bVar3);
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"|A-B| < 0.001? ");
  bVar3 = Eigen::MatrixBase<Eigen::Matrix<double,2,3,1,2,3>>::
          equals<Eigen::Matrix<double,2,3,1,2,3>>
                    ((MatrixBase<Eigen::Matrix<double,2,3,1,2,3>> *)local_470,
                     (MatrixBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)local_4b0,0.001);
  pvVar7 = (void *)std::ostream::operator<<(poVar4,bVar3);
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  local_4c4 = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_4c0,&local_4c4);
  local_4f0 = 2.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_4e8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4c0,&local_4f0)
  ;
  local_4f8 = 3.0;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_4e8,&local_4f8);
  local_500 = 4.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar8,&local_500);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_4e8);
  local_514 = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&local_510,&local_514);
  local_540 = 0.1;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator<<
            (&local_538,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_510,&local_540)
  ;
  local_548 = 0.2;
  pCVar8 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_538,&local_548);
  local_550 = 0.3;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar8,&local_550);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::~CommaInitializer(&local_538);
  poVar4 = std::operator<<((ostream *)&std::cout,"||v||_wrms, w = ");
  SVar12 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
           wrmsNorm<Eigen::Matrix<double,_1,1,0,_1,1>>
                     ((MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_4c0,
                      (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_510,(type *)0x0)
  ;
  pvVar7 = (void *)std::ostream::operator<<(poVar4,SVar12);
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"||v + v||_wrms, w = ");
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
            (&local_568,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_4c0,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4c0);
  SVar13 = Eigen::
           MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
           ::wrmsNorm<Eigen::Matrix<double,_1,1,0,_1,1>>
                     ((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                       *)&local_568,
                      (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_510,(type *)0x0)
  ;
  pvVar7 = (void *)std::ostream::operator<<(poVar4,SVar13);
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"v + v + 1: ");
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+
            (&local_5c0,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_4c0,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4c0);
  local_5c8 = 1.0;
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::operator+(&local_5a8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               *)&local_5c0,&local_5c8);
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
                                     *)&local_5a8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"1 + v: ");
  local_600 = 1.0;
  Eigen::operator+(&local_5f8,&local_600,
                   (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_4c0);
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                     *)&local_5f8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_510);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix(&local_4c0);
  poVar4 = std::operator<<((ostream *)&std::cout,"\n=== Matrix comparison tests ===\n");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_2,_3,_1,_2,_3>::Matrix((Matrix<double,_2,_3,_1,_2,_3> *)local_630);
  Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::setRandom(local_630);
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<Eigen::Matrix<double,2,3,1,2,3>>
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_648,(Matrix<double,_2,_3,_1,_2,_3> *)local_630);
  bVar3 = Eigen::MatrixBase<Eigen::Matrix<double,2,3,1,2,3>>::operator==
                    ((MatrixBase<Eigen::Matrix<double,2,3,1,2,3>> *)local_630,
                     (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_648);
  if (bVar3) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Matrices are exactly equal");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  pSVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1> *)&local_648,1,2
                     );
  *pSVar5 = *pSVar5 + 0.001;
  bVar3 = Eigen::MatrixBase<Eigen::Matrix<double,2,3,1,2,3>>::
          equals<Eigen::Matrix<double,_1,_1,1,_1,_1>>
                    ((MatrixBase<Eigen::Matrix<double,2,3,1,2,3>> *)local_630,
                     (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_648,0.002);
  if (bVar3) {
    std::operator<<((ostream *)&std::cout,"Matrices are equal within tol 0.002 \n");
  }
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix(&local_648);
  poVar4 = std::operator<<((ostream *)&std::cout,"\n=== Pasting matrices and matrix-blocks ===\n");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_668[1] = 4;
  local_668[0] = 6;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<int,int>
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_660,local_668 + 1,local_668);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::setRandom
            ((DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_660);
  poVar4 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_660);
  std::operator<<(poVar4,"\n\n");
  Eigen::Matrix<double,_2,_3,_1,_2,_3>::Matrix(&local_6a0);
  local_6c8 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::operator<<
            (&local_6c0,(DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)&local_6a0,&local_6c8);
  local_6d0 = 2.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::operator_
                     (&local_6c0,&local_6d0);
  local_6d8 = 3.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::operator_
                     (pCVar9,&local_6d8);
  local_6e0 = 4.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::operator_
                     (pCVar9,&local_6e0);
  local_6e8 = 5.0;
  pCVar9 = Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::operator_
                     (pCVar9,&local_6e8);
  local_6f0 = 6.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::operator_(pCVar9,&local_6f0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_3,_1,_2,_3>_>::~CommaInitializer(&local_6c0);
  poVar4 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)&local_6a0);
  std::operator<<(poVar4,"\n\n");
  Eigen::Matrix<double,_5,_7,_1,_5,_7>::Matrix(&local_808);
  Eigen::DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)&local_808);
  Eigen::DenseBase<Eigen::Matrix<double,5,7,1,5,7>>::block<2,3>
            (&local_858,(DenseBase<Eigen::Matrix<double,5,7,1,5,7>> *)&local_808,1,1);
  local_860 = 10.0;
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>::operator<<
            (&local_828,
             (DenseBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_> *)
             &local_858,&local_860);
  local_868 = 20.0;
  pCVar10 = Eigen::
            CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>::
            operator_(&local_828,&local_868);
  local_870 = 30.0;
  pCVar10 = Eigen::
            CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>::
            operator_(pCVar10,&local_870);
  local_878 = 40.0;
  pCVar10 = Eigen::
            CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>::
            operator_(pCVar10,&local_878);
  local_880 = 50.0;
  pCVar10 = Eigen::
            CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>::
            operator_(pCVar10,&local_880);
  local_888 = 60.0;
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>::
  operator_(pCVar10,&local_888);
  Eigen::CommaInitializer<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_>::
  ~CommaInitializer(&local_828);
  poVar4 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_5,_7,_1,_5,_7>_> *)&local_808);
  std::operator<<(poVar4,"\n\n");
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::Matrix(&local_8a0,&local_660);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::block<2,3>
            (&local_8d0,(DenseBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_8a0,1,2);
  Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,2,3,false>::operator=
            ((Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,2,3,false> *)&local_8d0,
             (DenseBase<Eigen::Matrix<double,_2,_3,_1,_2,_3>_> *)&local_6a0);
  poVar4 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_8a0);
  std::operator<<(poVar4,"\n\n");
  Eigen::DenseBase<Eigen::Matrix<double,5,7,1,5,7>>::block<2,3>
            (&local_900,(DenseBase<Eigen::Matrix<double,5,7,1,5,7>> *)&local_808,1,1);
  Eigen::DenseBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::block<2,3>
            (&local_930,(DenseBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_8a0,1,2);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,2,3,false>>::operator+=
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,2,3,false>> *)&local_930,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_5,_7,_1,_5,_7>,_2,_3,_false>_> *)
             &local_900);
  poVar4 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_8a0);
  std::operator<<(poVar4,"\n\n");
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix(&local_8a0);
  Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>::~Matrix(&local_660);
  poVar4 = std::operator<<((ostream *)&std::cout,"\n=== 3x3 matrix times vector ===\n");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  chrono::ChVector<double>::ChVector(&local_948,1.0,2.0,3.0);
  chrono::ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)local_990);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::setRandom(local_990);
  chrono::ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)local_9d8,1.0);
  poVar4 = Eigen::operator<<((ostream *)&std::cout,local_9d8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  chrono::ChMatrix33<double>::operator*(&local_9f0,(ChMatrix33<double> *)local_990,&local_948);
  local_a10.m_matrix =
       (non_const_type)Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::transpose(local_990)
  ;
  chrono::operator*(&local_a08,&local_a10,&local_948);
  poVar4 = Eigen::operator<<((ostream *)&std::cout,local_990);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = chrono::operator<<((ostream *)&std::cout,&local_9f0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = chrono::operator<<((ostream *)&std::cout,&local_a08);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"\n=== Custom 3x4, 4x3, and 4x4 matrices ===\n");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_0,_3,_4>_>::Ones((ConstantReturnType *)local_a90,3,4)
  ;
  Eigen::Matrix<double,3,4,1,3,4>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,4,0,3,4>>>
            (local_a80,local_a90);
  chrono::ChQuaternion<double>::ChQuaternion(&local_ab0,1.0,2.0,3.0,4.0);
  chrono::operator*(&local_ac8,(ChMatrix34<double> *)local_a80,&local_ab0);
  poVar4 = chrono::operator<<((ostream *)&std::cout,&local_ac8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_b6c = 2;
  local_b78 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_> *)local_a80);
  Eigen::operator*(&local_b68,&local_b6c,(StorageBaseType *)&local_b78);
  Eigen::Matrix<double,4,3,0,4,3>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,4,3,0,4,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,4,1,3,4>>const>>
            (local_b40,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_4,_3,_0,_4,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>_>_>
              *)&local_b68);
  poVar4 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_> *)local_b40);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  chrono::operator*(&local_b98,(ChMatrix43<double> *)local_b40,&local_ac8);
  chrono::ChQuaternion<double>::operator=(&local_ab0,&local_b98);
  poVar4 = chrono::operator<<((ostream *)&std::cout,&local_ab0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_bc0.m_matrix =
       (non_const_type)
       Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>::transpose
                 ((DenseBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_> *)local_a80);
  chrono::operator*(&local_bb8,&local_bc0,&local_ac8);
  chrono::ChQuaternion<double>::operator=(&local_ab0,&local_bb8);
  poVar4 = chrono::operator<<((ostream *)&std::cout,&local_ab0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  chrono::Q_from_AngX(0.5235987755982988);
  chrono::ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)local_c08,&local_c28);
  poVar4 = Eigen::operator<<((ostream *)&std::cout,local_c08);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_c30 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::transpose(local_c08);
  poVar4 = Eigen::operator<<((ostream *)&std::cout,
                             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>_> *)
                             &local_c30);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  local_cb0 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)local_c08,
                         (MatrixBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_> *)local_a80);
  Eigen::Matrix<double,3,4,1,3,4>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,4,1,3,4>,0>>
            (local_ca0,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_4,_1,_3,_4>,_0>_>
              *)&local_cb0);
  local_d38 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_> *)local_b40);
  local_d30 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)local_c08,
                         (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_4,_3,_0,_4,_3>_>_> *)
                         &local_d38);
  Eigen::Matrix<double,3,4,1,3,4>::
  Matrix<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Transpose<Eigen::Matrix<double,4,3,0,4,3>>,0>>
            (local_d20,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Transpose<Eigen::Matrix<double,_4,_3,_0,_4,_3>_>,_0>_>
              *)&local_d30);
  local_db0 = Eigen::MatrixBase<Eigen::Matrix<double,4,3,0,4,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,4,3,0,4,3>> *)local_b40,
                         (MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_c08);
  Eigen::Matrix<double,4,3,0,4,3>::
  Matrix<Eigen::Product<Eigen::Matrix<double,4,3,0,4,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (local_da0,
             (EigenBase<Eigen::Product<Eigen::Matrix<double,_4,_3,_0,_4,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_db0);
  local_e38 = (non_const_type)
              Eigen::DenseBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>::transpose
                        ((DenseBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_> *)local_a80);
  local_e30 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,4,1,3,4>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,4,1,3,4>>> *)&local_e38
                         ,(MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_c08);
  Eigen::Matrix<double,4,3,0,4,3>::
  Matrix<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,3,4,1,3,4>>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            (local_e20,
             (EigenBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_4,_1,_3,_4>_>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&local_e30);
  poVar4 = std::operator<<((ostream *)&std::cout,"rot * G:\n");
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_> *)local_ca0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"rot * (G\').transpose:\n");
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,_3,_4,_1,_3,_4>_> *)local_d20);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"G\' * rot:\n");
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_> *)local_da0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"G.transpose * rot:\n");
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,_4,_3,_0,_4,_3>_> *)local_e20);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_4,_4,_1,_4,_4>::Matrix((Matrix<double,_4,_4,_1,_4,_4> *)local_ec0);
  Eigen::DenseBase<Eigen::Matrix<double,_4,_4,_1,_4,_4>_>::setRandom(local_ec0);
  chrono::operator*(&local_ee0,(ChMatrix44<double> *)local_ec0,&local_ab0);
  poVar4 = std::operator<<((ostream *)&std::cout,"Random 4x4 * q:\n");
  poVar4 = chrono::operator<<(poVar4,&local_ee0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  chrono::ChQuaternion<double>::ChQuaternion(&local_fa0,1.0,2.0,3.0,4.0);
  chrono::ChStarMatrix44<double>::ChStarMatrix44((ChStarMatrix44<double> *)local_f80,&local_fa0);
  poVar4 = std::operator<<((ostream *)&std::cout,"4x4 star matrix X:\n");
  poVar4 = Eigen::operator<<(poVar4,local_f80);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  chrono::ChStarMatrix44<double>::semiTranspose((ChStarMatrix44<double> *)local_f80);
  poVar4 = std::operator<<((ostream *)&std::cout,"Semi-transpose X:\n");
  poVar4 = Eigen::operator<<(poVar4,local_f80);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  chrono::ChStarMatrix44<double>::semiNegate((ChStarMatrix44<double> *)local_f80);
  poVar4 = std::operator<<((ostream *)&std::cout,"Semi-negate X:\n");
  poVar4 = Eigen::operator<<(poVar4,local_f80);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"\n=== Use of ChTransform ===\n");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  chrono::ChVector<double>::ChVector(&local_fb8,2.0,3.0,4.0);
  chrono::ChVector<double>::ChVector(&local_fd0,5.0,6.0,7.0);
  chrono::ChQuaternion<double>::ChQuaternion(&local_ff0,1.0,3.0,4.0,5.0);
  chrono::ChQuaternion<double>::Normalize(&local_ff0);
  chrono::ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)local_1038);
  chrono::ChMatrix33<double>::Set_A_quaternion((ChMatrix33<double> *)local_1038,&local_ff0);
  chrono::ChCoordsys<double>::ChCoordsys(&local_1070,&local_fd0,&local_ff0);
  chrono::ChTransform<double>::TransformLocalToParent
            (&local_1088,&local_fb8,&local_fd0,(ChMatrix33<double> *)local_1038);
  chrono::ChTransform<double>::TransformLocalToParent(&local_10a0,&local_fb8,&local_fd0,&local_ff0);
  chrono::ChCoordsys<double>::TransformLocalToParent(&local_10b8,&local_1070,&local_fb8);
  chrono::ChMatrix33<double>::operator*(&local_10e8,(ChMatrix33<double> *)local_1038,&local_fb8);
  chrono::ChVector<double>::operator+(&local_10d0,&local_fd0,&local_10e8);
  bVar3 = chrono::ChVector<double>::Equals(&local_10a0,&local_1088,1e-06);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,bVar3);
  poVar4 = std::operator<<(poVar4," ");
  bVar3 = chrono::ChVector<double>::Equals(&local_10b8,&local_1088,1e-06);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,bVar3);
  poVar4 = std::operator<<(poVar4," ");
  bVar3 = chrono::ChVector<double>::Equals(&local_10d0,&local_1088,1e-06);
  pvVar7 = (void *)std::ostream::operator<<(poVar4,bVar3);
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  chrono::ChTransform<double>::TransformParentToLocal(&local_1100,&local_1088,&local_fd0,&local_ff0)
  ;
  chrono::ChTransform<double>::TransformParentToLocal
            (&local_1118,&local_1088,&local_fd0,(ChMatrix33<double> *)local_1038);
  chrono::ChCoordsys<double>::TransformParentToLocal(&local_1130,&local_1070,&local_1088);
  local_1150.m_matrix =
       (non_const_type)
       Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::transpose(local_1038);
  chrono::ChVector<double>::operator-(&local_1168,&local_1088,&local_fd0);
  chrono::operator*(&local_1148,&local_1150,&local_1168);
  bVar3 = chrono::ChVector<double>::Equals(&local_1100,&local_fb8,1e-06);
  poVar4 = (ostream *)std::ostream::operator<<(&std::cout,bVar3);
  poVar4 = std::operator<<(poVar4," ");
  bVar3 = chrono::ChVector<double>::Equals(&local_1118,&local_fb8,1e-06);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,bVar3);
  poVar4 = std::operator<<(poVar4," ");
  bVar3 = chrono::ChVector<double>::Equals(&local_1130,&local_fb8,1e-06);
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,bVar3);
  poVar4 = std::operator<<(poVar4," ");
  bVar3 = chrono::ChVector<double>::Equals(&local_1148,&local_fb8,1e-06);
  pvVar7 = (void *)std::ostream::operator<<(poVar4,bVar3);
  std::ostream::operator<<(pvVar7,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"\n=== Linear systems ===\n");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Eigen::Matrix<double,_3,_3,_1,_3,_3>::Matrix((Matrix<double,_3,_3,_1,_3,_3> *)local_11b0);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix(&local_11c8);
  local_11f0 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator<<
            (&local_11e8,local_11b0,&local_11f0);
  local_11f8 = 2.0;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                      (&local_11e8,&local_11f8);
  local_1200 = 3.0;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                      (pCVar11,&local_1200);
  local_1208 = 4.0;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                      (pCVar11,&local_1208);
  local_1210 = 5.0;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                      (pCVar11,&local_1210);
  local_1218 = 6.0;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                      (pCVar11,&local_1218);
  local_1220 = 7.0;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                      (pCVar11,&local_1220);
  local_1228 = 8.0;
  pCVar11 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_
                      (pCVar11,&local_1228);
  local_1230 = 10.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::operator_(pCVar11,&local_1230);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::~CommaInitializer(&local_11e8);
  local_1258 = 3.0;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
            (&local_1250,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_11c8,&local_1258
            );
  local_1260 = 3.0;
  this = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                   (&local_1250,&local_1260);
  local_1268 = 4.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(this,&local_1268);
  Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_1250);
  poVar4 = std::operator<<((ostream *)&std::cout,"matrix A:\n");
  poVar4 = Eigen::operator<<(poVar4,local_11b0);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"vector b:\n");
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_11c8)
  ;
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::colPivHouseholderQr
            (&local_1388,(MatrixBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)local_11b0);
  local_1290 = Eigen::SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,3,1,3,3>>>::
               solve<Eigen::Matrix<double,3,1,0,3,1>>
                         ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,3,1,3,3>>> *
                          )&local_1388,
                          (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_11c8);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,3,1,3,3>>,Eigen::Matrix<double,3,1,0,3,1>>>
            (local_1280,
             (EigenBase<Eigen::Solve<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_1290);
  Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>::~ColPivHouseholderQR
            (&local_1388);
  poVar4 = std::operator<<((ostream *)&std::cout,"solution:\n");
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_1280);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  poVar4 = std::operator<<((ostream *)&std::cout,"Ax-b:\n");
  local_13b8 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,1,3,3>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,3,3,1,3,3>> *)local_11b0,
                          (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_1280);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>::
  operator-(&local_13a8,
            (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
             *)&local_13b8,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)&local_11c8);
  poVar4 = Eigen::operator<<(poVar4,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                     *)&local_13a8);
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
    ///! [Basic operations with matrices]
    std::cout << "\n=== Creation and assignment ===\n" << std::endl;
    {
        // Matrix allocated on the heap.
        chrono::ChMatrixDynamic<> Md1(5, 7);
        chrono::ChMatrixDynamic<> Md2(4, 4);

        // Matrix allocated on the stack.
        chrono::ChMatrixNM<double, 4, 4> Ms;

        // 3x3 matrices, mostly used for coordinate transformations.
        chrono::ChMatrix33<> ma;

        Ms.setConstant(0.1);  // Fill a matrix with an element
        std::cout << Ms << std::endl;

        Md1.setRandom();         // initialize with random numbers
        Md1.transposeInPlace();  // transpose the matrix in place
        Md1.resize(2, 2);        // resize
        Md1.setZero();           // set all elements to zero

        Md2.setIdentity();  // Create a diagonal matrix
        Md2 *= 3;

        Md2(0, 0) = 10;  // Use the () operator to reference single elements
        Md2(1, 2) = Md2(0, 0) + Md2(1, 1);
        Md2(2, 2) = 4;

        chrono::ChMatrixDynamic<> M1(Md2);   // Copy constructor
        chrono::ChMatrixDynamic<> M2(-Ms);   // The - unary operator returns a negated matrix
        chrono::ChMatrixDynamic<> M3(8, 4);  // 8x4 uninitialized matrix
        M3 = M1;                             // Copy (resize as needed)
        M3 = M1.transpose();                 // transposed copy.
    }

    std::cout << "\n=== Matrix operations ===\n" << std::endl;
    {
        chrono::ChMatrixNM<double, 2, 3> A;
        chrono::ChMatrixDynamic<double> B(2, 3);
        A.setRandom();
        B.setRandom();
        chrono::ChMatrixDynamic<> result(A + B);
        result = A + B;
        result = A;
        result += B;

        // Different ways to do subtraction..
        result = A - B;
        result = A;
        result -= B;

        // Multiplication with scalar
        result = A * 10;
        result = 10 * A;
        std::cout << result << std::endl;

        result = A;
        result *= 10;
        std::cout << result << std::endl;

        // Matrix multiplications
        chrono::ChMatrixDynamic<> C(3, 2);
        chrono::ChMatrixDynamic<> D(2, 3);
        chrono::ChMatrixDynamic<double> CD = C * D;
        chrono::ChMatrixDynamic<double> CD_t = D.transpose() * C.transpose();

        chrono::ChMatrix33<> R(chrono::Q_from_AngX(chrono::CH_C_PI / 3));
        std::cout << "rot * matrix\n" << R * C << std::endl;
        std::cout << "matrix * rot\n" << D * R << std::endl;
    }

    std::cout << "\n=== Chrono extensions to Eigen::MatrixBase ===\n" << std::endl;
    {
        chrono::ChMatrixNM<double, 2, 3> A;
        A.setRandom();
        std::cout << "random 2x3 matrix A:\n" << A << std::endl;
        A.fillDiagonal(10.1);
        std::cout << "fill diagonal with 10.1:\n" << A << std::endl;
        A.fill(2.1);
        std::cout << "fill entire matrix with 2.1:\n" << A << std::endl;

        chrono::ChMatrixNM<double, 2, 3> B(A);
        B(1, 2) += 0.01;
        std::cout << "matrix B = A with B(1,2) incremented by 0.01\n" << B << std::endl;
        std::cout << "|A-B| < 0.1?   " << A.equals(B, 0.1) << std::endl;
        std::cout << "|A-B| < 0.001? " << A.equals(B, 0.001) << std::endl;

        chrono::ChVectorDynamic<> v(3);
        v << 2, 3, 4;
        chrono::ChVectorDynamic<> w(3);
        w << 0.1, 0.2, 0.3;
        std::cout << "||v||_wrms, w = " << v.wrmsNorm(w) << std::endl;
        std::cout << "||v + v||_wrms, w = " << (v + v).wrmsNorm(w) << std::endl;

        std::cout << "v + v + 1: " << (v + v) + 1 << std::endl;
        std::cout << "1 + v: " << 1 + v << std::endl;
    }

    std::cout << "\n=== Matrix comparison tests ===\n" << std::endl;
    {
        chrono::ChMatrixNM<double, 2, 3> A;
        A.setRandom();
        chrono::ChMatrixDynamic<> B(A);
        if (A == B) {
            std::cout << "Matrices are exactly equal" << std::endl;
        }

        // Tolerance comparison
        B(1, 2) += 0.001;
        if (A.equals(B, 0.002)) {
            std::cout << "Matrices are equal within tol 0.002 \n";
        }
    }

    std::cout << "\n=== Pasting matrices and matrix-blocks ===\n" << std::endl;
    {
        chrono::ChMatrixDynamic<> A(4, 6);
        A.setRandom();
        std::cout << A << "\n\n";

        chrono::ChMatrixNM<double, 2, 3> B;
        B << 1, 2, 3, 4, 5, 6;
        std::cout << B << "\n\n";

        chrono::ChMatrixNM<double, 5, 7> C;
        C.setZero();
        C.block<2, 3>(1, 1) << 10, 20, 30, 40, 50, 60;
        std::cout << C << "\n\n";

        chrono::ChMatrixDynamic<> X = A;
        X.block<2, 3>(1, 2) = B;
        std::cout << X << "\n\n";

        X.block<2, 3>(1, 2) += C.block<2, 3>(1, 1);
        std::cout << X << "\n\n";
    }

    std::cout << "\n=== 3x3 matrix times vector ===\n" << std::endl;
    {
        chrono::ChVector<> v(1, 2, 3);
        chrono::ChMatrix33<> A;
        A.setRandom();

        chrono::ChMatrix33<> B(1);
        std::cout << B << std::endl;

        // Vector transformation, typical product [A] * v
        chrono::ChVector<> res1 = A * v;

        // Inverse vector transformation, [A]' * v
        chrono::ChVector<> res2 = A.transpose() * v;

        std::cout << A << std::endl;
        std::cout << res1 << std::endl;
        std::cout << res2 << std::endl;
    }

    std::cout << "\n=== Custom 3x4, 4x3, and 4x4 matrices ===\n" << std::endl;
    {
        chrono::ChMatrix34<> G = Eigen::Matrix<double, 3, 4>::Ones(3, 4);
        chrono::ChQuaternion<> q(1, 2, 3, 4);
        chrono::ChVector<> v = G * q;
        std::cout << v << std::endl;

        chrono::ChMatrix43<> Gt = 2 * G.transpose();
        std::cout << Gt << std::endl;
        q = Gt * v;
        std::cout << q << std::endl;
        q = G.transpose() * v;
        std::cout << q << std::endl;

        chrono::ChMatrix33<> rot(chrono::Q_from_AngX(chrono::CH_C_PI / 6));
        std::cout << rot << std::endl;
        std::cout << rot.transpose() << std::endl;

        chrono::ChMatrix34<> res1 = rot * G;
        chrono::ChMatrix34<> res2 = rot * Gt.transpose();
        chrono::ChMatrix43<> res3 = Gt * rot;
        chrono::ChMatrix43<> res4 = G.transpose() * rot;
        std::cout << "rot * G:\n" << res1 << std::endl;
        std::cout << "rot * (G').transpose:\n" << res2 << std::endl;
        std::cout << "G' * rot:\n" << res3 << std::endl;
        std::cout << "G.transpose * rot:\n" << res4 << std::endl;

        chrono::ChMatrix44<> A44;
        A44.setRandom();
        chrono::ChQuaternion<> q2 = A44 * q;
        std::cout << "Random 4x4 * q:\n" << q2 << std::endl; 

        chrono::ChStarMatrix44<> X(chrono::ChQuaternion<>(1, 2, 3, 4));
        std::cout << "4x4 star matrix X:\n" << X << std::endl;
        X.semiTranspose();
        std::cout << "Semi-transpose X:\n" << X << std::endl;
        X.semiNegate();
        std::cout << "Semi-negate X:\n" << X << std::endl;
    }

    std::cout << "\n=== Use of ChTransform ===\n" << std::endl;
    {
        chrono::ChVector<> vl(2, 3, 4);        // local point to transform
        chrono::ChVector<> t(5, 6, 7);         // translation of coord system
        chrono::ChQuaternion<> q(1, 3, 4, 5);  // rotation of coord system (quaternion)
        q.Normalize();                         // as unit quaternion, must be normalized
        chrono::ChMatrix33<> R;                // rotation of coord system (rotation matrix)
        R.Set_A_quaternion(q);                 // set from quaternion
        chrono::Coordsys csys(t, q);           // coordinate system representing translation + rotation

        // Perform the transformation: v = t + [R] * v'
        // NOTE: all the following ways will give the same result, so you can use them equivalently!
        auto va1 = chrono::ChTransform<>::TransformLocalToParent(vl, t, R);
        auto va2 = chrono::ChTransform<>::TransformLocalToParent(vl, t, q);
        auto va3 = csys.TransformLocalToParent(vl);
        auto va4 = t + R * vl;
        std::cout << va2.Equals(va1, 1e-6) << " " << va3.Equals(va1, 1e-6) << " " << va4.Equals(va1, 1e-6) << std::endl;

        // Inverse transformation
        auto vl1 = chrono::ChTransform<>::TransformParentToLocal(va1, t, q);
        auto vl2 = chrono::ChTransform<>::TransformParentToLocal(va1, t, R);
        auto vl3 = csys.TransformParentToLocal(va1);
        auto vl4 = R.transpose() * (va1 - t);
        std::cout << vl1.Equals(vl, 1e-6) << " " << vl2.Equals(vl, 1e-6) << " " << vl3.Equals(vl, 1e-6) << " "
                  << vl4.Equals(vl, 1e-6) << std::endl;
    }

    std::cout << "\n=== Linear systems ===\n" << std::endl;
    {
        chrono::ChMatrixNM<double, 3, 3> A;
        Eigen::Vector3d b;
        A << 1, 2, 3, 4, 5, 6, 7, 8, 10;
        b << 3, 3, 4;
        std::cout << "matrix A:\n" << A << std::endl;
        std::cout << "vector b:\n" << b << std::endl;
        Eigen::Vector3d x = A.colPivHouseholderQr().solve(b);
        std::cout << "solution:\n" << x << std::endl;
        std::cout << "Ax-b:\n" << A * x - b << std::endl;
    }
    ///! [Basic operations with matrices]

    return 0;
}